

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

void png_build_8bit_table(png_structrp png_ptr,png_bytepp ptable,png_fixed_point gamma_val)

{
  png_byte pVar1;
  png_byte *ppVar2;
  long lVar3;
  
  ppVar2 = (png_byte *)png_malloc(png_ptr,0x100);
  *ptable = ppVar2;
  if (gamma_val - 95000U < 0x2711) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      ppVar2[lVar3] = (png_byte)lVar3;
    }
  }
  else {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      pVar1 = png_gamma_8bit_correct((uint)lVar3,gamma_val);
      ppVar2[lVar3] = pVar1;
    }
  }
  return;
}

Assistant:

static void
png_build_8bit_table(png_structrp png_ptr, png_bytepp ptable,
    png_fixed_point gamma_val)
{
   unsigned int i;
   png_bytep table = *ptable = (png_bytep)png_malloc(png_ptr, 256);

   if (png_gamma_significant(gamma_val) != 0)
      for (i=0; i<256; i++)
         table[i] = png_gamma_8bit_correct(i, gamma_val);

   else
      for (i=0; i<256; ++i)
         table[i] = (png_byte)(i & 0xff);
}